

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

void __thiscall capnp::StreamFdMessageReader::~StreamFdMessageReader(StreamFdMessageReader *this)

{
  ~StreamFdMessageReader
            ((StreamFdMessageReader *)&this[-1].super_InputStreamMessageReader.ownedSpace.disposer);
  return;
}

Assistant:

void writeMessageToFd(int fd, kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
#ifdef _WIN32
    auto oldMode = _setmode(fd, _O_BINARY);
    if (oldMode != _O_BINARY) {
      _setmode(fd, oldMode);
      KJ_FAIL_REQUIRE("Tried to write a message to a file descriptor that is in text mode. Set the "
          "file descriptor to binary mode by calling the _setmode Windows CRT function, or passing "
          "_O_BINARY to _open().");
    }
#endif
  kj::FdOutputStream stream(fd);
  writeMessage(stream, segments);
}